

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void __thiscall
duckdb::DictionaryCompressionCompressState::AddNewString
          (DictionaryCompressionCompressState *this,string_t str)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  atomic<unsigned_long> *paVar1;
  uint uVar2;
  pointer pCVar3;
  type segment;
  undefined8 uVar4;
  anon_union_16_2_67f50693_for_value local_48;
  uint local_38;
  char acStack_34 [4];
  char *pcStack_30;
  int local_28;
  
  local_48.pointer.ptr = (char *)str.value._8_8_;
  local_48._0_8_ = str.value._0_8_;
  this_00 = &this->current_segment;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  StringStats::Update(&(pCVar3->stats).statistics,(string_t *)&local_48.pointer);
  uVar2 = (this->current_dictionary).size + local_48.pointer.length;
  pcStack_30 = (char *)(this->current_end_ptr + -(ulong)uVar2);
  (this->current_dictionary).size = uVar2;
  uVar4 = local_48.pointer.ptr;
  if ((local_48._0_8_ & 0xffffffff) < 0xd) {
    uVar4 = local_48.pointer.prefix;
  }
  switchD_00916250::default(pcStack_30,(void *)uVar4,local_48._0_8_ & 0xffffffff);
  CompressionInfo::GetBlockSize
            (&(this->super_DictionaryCompressionState).super_CompressionState.info);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&(this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             &(this->current_dictionary).size);
  local_38 = (int)((ulong)((long)(this->index_buffer).
                                 super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->index_buffer).
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2) - 1;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&(this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             &local_38);
  uVar4 = local_48._0_8_;
  if ((uint)local_48._0_4_ < 0xd) {
    acStack_34[0] = local_48.pointer.prefix[0];
    acStack_34[1] = local_48.pointer.prefix[1];
    acStack_34[2] = local_48.pointer.prefix[2];
    acStack_34[3] = local_48.pointer.prefix[3];
    pcStack_30 = local_48.pointer.ptr;
    local_28 = (int)((ulong)((long)(this->index_buffer).
                                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->index_buffer).
                                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
  }
  else {
    acStack_34 = *(char (*) [4])pcStack_30;
    local_28 = (int)((ulong)((long)(this->index_buffer).
                                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->index_buffer).
                                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
  }
  local_28 = local_28 + -1;
  local_38 = local_48.pointer.length;
  local_48._0_8_ = uVar4;
  ::std::
  _Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_int>,std::allocator<std::pair<duckdb::string_t_const,unsigned_int>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<duckdb::string_t_const,unsigned_int>>
            ((_Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_int>,std::allocator<std::pair<duckdb::string_t_const,unsigned_int>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->current_string_map);
  segment = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
            operator*(this_00);
  DictionaryCompression::SetDictionary(segment,&this->current_handle,this->current_dictionary);
  this->current_width = this->next_width;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  LOCK();
  paVar1 = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void DictionaryCompressionCompressState::AddNewString(string_t str) {
	UncompressedStringStorage::UpdateStringStats(current_segment->stats, str);

	// Copy string to dict
	current_dictionary.size += str.GetSize();
	auto dict_pos = current_end_ptr - current_dictionary.size;
	memcpy(dict_pos, str.GetData(), str.GetSize());
	current_dictionary.Verify(info.GetBlockSize());
	D_ASSERT(current_dictionary.end == info.GetBlockSize());

	// Update buffers and map
	index_buffer.push_back(current_dictionary.size);
	selection_buffer.push_back(UnsafeNumericCast<uint32_t>(index_buffer.size() - 1));
	if (str.IsInlined()) {
		current_string_map.insert({str, index_buffer.size() - 1});
	} else {
		string_t dictionary_string((const char *)dict_pos, UnsafeNumericCast<uint32_t>(str.GetSize())); // NOLINT
		D_ASSERT(!dictionary_string.IsInlined());
		current_string_map.insert({dictionary_string, index_buffer.size() - 1});
	}
	DictionaryCompression::SetDictionary(*current_segment, current_handle, current_dictionary);

	current_width = next_width;
	current_segment->count++;
}